

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngpread.c
# Opt level: O1

void png_push_fill_buffer(png_structp png_ptr,png_bytep buffer,size_t length)

{
  size_t save_size;
  ulong uVar1;
  
  if (png_ptr != (png_structp)0x0) {
    uVar1 = png_ptr->save_buffer_size;
    if (uVar1 != 0) {
      if (length <= uVar1) {
        uVar1 = length;
      }
      memcpy(buffer,png_ptr->save_buffer_ptr,uVar1);
      png_ptr->buffer_size = png_ptr->buffer_size - uVar1;
      length = length - uVar1;
      png_ptr->save_buffer_size = png_ptr->save_buffer_size - uVar1;
      buffer = buffer + uVar1;
      png_ptr->save_buffer_ptr = png_ptr->save_buffer_ptr + uVar1;
    }
    if ((length != 0) && (uVar1 = png_ptr->current_buffer_size, uVar1 != 0)) {
      if (length < uVar1) {
        uVar1 = length;
      }
      memcpy(buffer,png_ptr->current_buffer_ptr,uVar1);
      png_ptr->buffer_size = png_ptr->buffer_size - uVar1;
      png_ptr->current_buffer_size = png_ptr->current_buffer_size - uVar1;
      png_ptr->current_buffer_ptr = png_ptr->current_buffer_ptr + uVar1;
    }
  }
  return;
}

Assistant:

void PNGCBAPI
png_push_fill_buffer(png_structp png_ptr, png_bytep buffer, size_t length)
{
   png_bytep ptr;

   if (png_ptr == NULL)
      return;

   ptr = buffer;
   if (png_ptr->save_buffer_size != 0)
   {
      size_t save_size;

      if (length < png_ptr->save_buffer_size)
         save_size = length;

      else
         save_size = png_ptr->save_buffer_size;

      memcpy(ptr, png_ptr->save_buffer_ptr, save_size);
      length -= save_size;
      ptr += save_size;
      png_ptr->buffer_size -= save_size;
      png_ptr->save_buffer_size -= save_size;
      png_ptr->save_buffer_ptr += save_size;
   }
   if (length != 0 && png_ptr->current_buffer_size != 0)
   {
      size_t save_size;

      if (length < png_ptr->current_buffer_size)
         save_size = length;

      else
         save_size = png_ptr->current_buffer_size;

      memcpy(ptr, png_ptr->current_buffer_ptr, save_size);
      png_ptr->buffer_size -= save_size;
      png_ptr->current_buffer_size -= save_size;
      png_ptr->current_buffer_ptr += save_size;
   }
}